

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void Client::handle_in(Client *self)

{
  pointer pp_Var1;
  pointer pcVar2;
  ParseStatus PVar3;
  HTTPResponse *this;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  pointer pp_Var4;
  
  self->time_stamp = self->server->time_stamp;
  ReadBuffer::do_read(&(self->request).buffer);
  do {
    PVar3 = HTTPRequest::parse(&self->request);
    if (PVar3 != PARSE_NEW_REQUEST) {
      return;
    }
    pp_Var1 = (self->server->http_request_hook).
              super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pp_Var4 = (self->server->http_request_hook).
                   super__Vector_base<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
                   ._M_impl.super__Vector_impl_data._M_start; pp_Var4 != pp_Var1;
        pp_Var4 = pp_Var4 + 1) {
      this = (**pp_Var4)(self);
      if (this != (HTTPResponse *)0x0) {
        HTTPResponse::parse(this);
        HTTPResponse::send(this,self->fd,__buf,in_RCX,in_R8D);
        pcVar2 = (this->raw)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(this->raw).field_2) {
          operator_delete(pcVar2);
        }
        pcVar2 = (this->data)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(this->data).field_2) {
          operator_delete(pcVar2);
        }
        std::__cxx11::
        _List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_M_clear(&(this->header).
                    super__List_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  );
        pcVar2 = (this->status)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(this->status).field_2) {
          operator_delete(pcVar2);
        }
        pcVar2 = (this->version)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(this->version).field_2) {
          operator_delete(pcVar2);
        }
        operator_delete(this);
        break;
      }
    }
    HTTPRequest::clean(&self->request);
  } while( true );
}

Assistant:

void Client::handle_in(Client *self) {
    self->time_stamp = self->server->time_stamp;
    self->request.buffer.do_read();
    while (self->request.parse() == PARSE_NEW_REQUEST) {
        for (auto func : self->server->http_request_hook) {
            auto response = func(self);
            if (response != nullptr) {
                response->parse();
                response->send(self->fd);
                delete response;
                break;
            }
        }
        self->request.clean();
    }
}